

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O3

void __thiscall
adios2::transport::FileFStream::SetBuffer(FileFStream *this,char *buffer,size_t size)

{
  long *plVar1;
  size_type *psVar2;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (size != 0 && buffer == (char *)0x0) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Toolkit","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"transport::file::FileFStream","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"SetBuffer","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"buffer size must be 0 when using a NULL buffer","");
    helper::Throw<std::invalid_argument>(&local_d0,&local_b0,&local_50,&local_70,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  (**(code **)(*(long *)&this->field_0x108 + 0x18))(&this->field_0x108,buffer,size);
  std::operator+(&local_d0,"couldn\'t set buffer in file ",&(this->super_Transport).m_Name);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_d0);
  psVar2 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = plVar1[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_90._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  CheckFile(this,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FileFStream::SetBuffer(char *buffer, size_t size)
{
    if (!buffer && size != 0)
    {
        helper::Throw<std::invalid_argument>("Toolkit", "transport::file::FileFStream", "SetBuffer",
                                             "buffer size must be 0 when using a NULL buffer");
    }
    m_FileStream.rdbuf()->pubsetbuf(buffer, size);
    CheckFile("couldn't set buffer in file " + m_Name + ", in call to fstream rdbuf()->pubsetbuf");
}